

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O0

void helper_msa_ceq_b_mips64(CPUMIPSState_conflict5 *env,uint32_t wd,uint32_t ws,uint32_t wt)

{
  int8_t iVar1;
  fpr_t *pfVar2;
  fpr_t *pfVar3;
  fpr_t *pfVar4;
  wr_t *pwt;
  wr_t *pws;
  wr_t *pwd;
  uint32_t wt_local;
  uint32_t ws_local;
  uint32_t wd_local;
  CPUMIPSState_conflict5 *env_local;
  
  pfVar2 = (env->active_fpu).fpr + wd;
  pfVar3 = (env->active_fpu).fpr + ws;
  pfVar4 = (env->active_fpu).fpr + wt;
  iVar1 = msa_ceq_b(*(int8_t *)pfVar3,*(int8_t *)pfVar4);
  *(int8_t *)pfVar2 = iVar1;
  iVar1 = msa_ceq_b(*(int8_t *)((long)pfVar3 + 1),*(int8_t *)((long)pfVar4 + 1));
  *(int8_t *)((long)pfVar2 + 1) = iVar1;
  iVar1 = msa_ceq_b(*(int8_t *)((long)pfVar3 + 2),*(int8_t *)((long)pfVar4 + 2));
  *(int8_t *)((long)pfVar2 + 2) = iVar1;
  iVar1 = msa_ceq_b(*(int8_t *)((long)pfVar3 + 3),*(int8_t *)((long)pfVar4 + 3));
  *(int8_t *)((long)pfVar2 + 3) = iVar1;
  iVar1 = msa_ceq_b(*(int8_t *)((long)pfVar3 + 4),*(int8_t *)((long)pfVar4 + 4));
  *(int8_t *)((long)pfVar2 + 4) = iVar1;
  iVar1 = msa_ceq_b(*(int8_t *)((long)pfVar3 + 5),*(int8_t *)((long)pfVar4 + 5));
  *(int8_t *)((long)pfVar2 + 5) = iVar1;
  iVar1 = msa_ceq_b(*(int8_t *)((long)pfVar3 + 6),*(int8_t *)((long)pfVar4 + 6));
  *(int8_t *)((long)pfVar2 + 6) = iVar1;
  iVar1 = msa_ceq_b(*(int8_t *)((long)pfVar3 + 7),*(int8_t *)((long)pfVar4 + 7));
  *(int8_t *)((long)pfVar2 + 7) = iVar1;
  iVar1 = msa_ceq_b(*(int8_t *)((long)pfVar3 + 8),*(int8_t *)((long)pfVar4 + 8));
  *(int8_t *)((long)pfVar2 + 8) = iVar1;
  iVar1 = msa_ceq_b(*(int8_t *)((long)pfVar3 + 9),*(int8_t *)((long)pfVar4 + 9));
  *(int8_t *)((long)pfVar2 + 9) = iVar1;
  iVar1 = msa_ceq_b(*(int8_t *)((long)pfVar3 + 10),*(int8_t *)((long)pfVar4 + 10));
  *(int8_t *)((long)pfVar2 + 10) = iVar1;
  iVar1 = msa_ceq_b(*(int8_t *)((long)pfVar3 + 0xb),*(int8_t *)((long)pfVar4 + 0xb));
  *(int8_t *)((long)pfVar2 + 0xb) = iVar1;
  iVar1 = msa_ceq_b(*(int8_t *)((long)pfVar3 + 0xc),*(int8_t *)((long)pfVar4 + 0xc));
  *(int8_t *)((long)pfVar2 + 0xc) = iVar1;
  iVar1 = msa_ceq_b(*(int8_t *)((long)pfVar3 + 0xd),*(int8_t *)((long)pfVar4 + 0xd));
  *(int8_t *)((long)pfVar2 + 0xd) = iVar1;
  iVar1 = msa_ceq_b(*(int8_t *)((long)pfVar3 + 0xe),*(int8_t *)((long)pfVar4 + 0xe));
  *(int8_t *)((long)pfVar2 + 0xe) = iVar1;
  iVar1 = msa_ceq_b(*(int8_t *)((long)pfVar3 + 0xf),*(int8_t *)((long)pfVar4 + 0xf));
  *(int8_t *)((long)pfVar2 + 0xf) = iVar1;
  return;
}

Assistant:

void helper_msa_ceq_b(CPUMIPSState *env, uint32_t wd, uint32_t ws, uint32_t wt)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    wr_t *pwt = &(env->active_fpu.fpr[wt].wr);

    pwd->b[0]  = msa_ceq_b(pws->b[0],  pwt->b[0]);
    pwd->b[1]  = msa_ceq_b(pws->b[1],  pwt->b[1]);
    pwd->b[2]  = msa_ceq_b(pws->b[2],  pwt->b[2]);
    pwd->b[3]  = msa_ceq_b(pws->b[3],  pwt->b[3]);
    pwd->b[4]  = msa_ceq_b(pws->b[4],  pwt->b[4]);
    pwd->b[5]  = msa_ceq_b(pws->b[5],  pwt->b[5]);
    pwd->b[6]  = msa_ceq_b(pws->b[6],  pwt->b[6]);
    pwd->b[7]  = msa_ceq_b(pws->b[7],  pwt->b[7]);
    pwd->b[8]  = msa_ceq_b(pws->b[8],  pwt->b[8]);
    pwd->b[9]  = msa_ceq_b(pws->b[9],  pwt->b[9]);
    pwd->b[10] = msa_ceq_b(pws->b[10], pwt->b[10]);
    pwd->b[11] = msa_ceq_b(pws->b[11], pwt->b[11]);
    pwd->b[12] = msa_ceq_b(pws->b[12], pwt->b[12]);
    pwd->b[13] = msa_ceq_b(pws->b[13], pwt->b[13]);
    pwd->b[14] = msa_ceq_b(pws->b[14], pwt->b[14]);
    pwd->b[15] = msa_ceq_b(pws->b[15], pwt->b[15]);
}